

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O3

void __thiscall btRigidBody::applyDamping(btRigidBody *this,btScalar timeStep)

{
  float fVar1;
  float fVar2;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  float fVar8;
  float fVar9;
  undefined8 uVar3;
  float fVar7;
  
  fVar1 = powf(1.0 - this->m_linearDamping,timeStep);
  uVar3 = *(undefined8 *)(this->m_linearVelocity).m_floats;
  *(ulong *)(this->m_linearVelocity).m_floats =
       CONCAT44(fVar1 * (float)((ulong)uVar3 >> 0x20),fVar1 * (float)uVar3);
  (this->m_linearVelocity).m_floats[2] = fVar1 * (this->m_linearVelocity).m_floats[2];
  fVar1 = powf(1.0 - this->m_angularDamping,timeStep);
  uVar3 = *(undefined8 *)(this->m_angularVelocity).m_floats;
  fVar2 = fVar1 * (float)uVar3;
  fVar4 = fVar1 * (float)((ulong)uVar3 >> 0x20);
  uVar3 = CONCAT44(fVar4,fVar2);
  *(undefined8 *)(this->m_angularVelocity).m_floats = uVar3;
  fVar1 = fVar1 * (this->m_angularVelocity).m_floats[2];
  (this->m_angularVelocity).m_floats[2] = fVar1;
  if (this->m_additionalDamping == true) {
    uVar6 = *(undefined8 *)(this->m_linearVelocity).m_floats;
    fVar5 = (float)uVar6;
    fVar7 = (float)((ulong)uVar6 >> 0x20);
    fVar8 = (this->m_linearVelocity).m_floats[2];
    if ((fVar1 * fVar1 + fVar2 * fVar2 + fVar4 * fVar4 <
         this->m_additionalAngularDampingThresholdSqr) &&
       (fVar8 * fVar8 + fVar5 * fVar5 + fVar7 * fVar7 < this->m_additionalLinearDampingThresholdSqr)
       ) {
      fVar9 = this->m_additionalDampingFactor;
      fVar1 = fVar1 * fVar9;
      fVar8 = fVar8 * fVar9;
      fVar4 = fVar4 * fVar9;
      uVar3 = CONCAT44(fVar4,fVar2 * fVar9);
      *(undefined8 *)(this->m_angularVelocity).m_floats = uVar3;
      (this->m_angularVelocity).m_floats[2] = fVar1;
      fVar7 = fVar7 * fVar9;
      uVar6 = CONCAT44(fVar7,fVar5 * fVar9);
      *(undefined8 *)(this->m_linearVelocity).m_floats = uVar6;
      (this->m_linearVelocity).m_floats[2] = fVar8;
    }
    fVar2 = SQRT(fVar8 * fVar8 + (float)uVar6 * (float)uVar6 + fVar7 * fVar7);
    if (fVar2 < this->m_linearDamping) {
      if (fVar2 <= 0.005) {
        (this->m_linearVelocity).m_floats[0] = 0.0;
        (this->m_linearVelocity).m_floats[1] = 0.0;
        (this->m_linearVelocity).m_floats[2] = 0.0;
        (this->m_linearVelocity).m_floats[3] = 0.0;
      }
      else {
        uVar6 = *(undefined8 *)(this->m_linearVelocity).m_floats;
        fVar8 = (float)uVar6;
        fVar5 = (float)((ulong)uVar6 >> 0x20);
        fVar2 = (this->m_linearVelocity).m_floats[2];
        fVar9 = 1.0 / SQRT(fVar2 * fVar2 + fVar8 * fVar8 + fVar5 * fVar5);
        *(ulong *)(this->m_linearVelocity).m_floats =
             CONCAT44(fVar7 + fVar9 * fVar5 * -0.005,fVar8 + fVar9 * fVar8 * -0.005);
        (this->m_linearVelocity).m_floats[2] = fVar2 * fVar9 * -0.005 + fVar2;
      }
    }
    fVar1 = SQRT(fVar1 * fVar1 + (float)uVar3 * (float)uVar3 + fVar4 * fVar4);
    if (fVar1 < this->m_angularDamping) {
      if (fVar1 <= 0.005) {
        (this->m_angularVelocity).m_floats[0] = 0.0;
        (this->m_angularVelocity).m_floats[1] = 0.0;
        (this->m_angularVelocity).m_floats[2] = 0.0;
        (this->m_angularVelocity).m_floats[3] = 0.0;
      }
      else {
        uVar3 = *(undefined8 *)(this->m_angularVelocity).m_floats;
        fVar2 = (float)uVar3;
        fVar8 = (float)((ulong)uVar3 >> 0x20);
        fVar1 = (this->m_angularVelocity).m_floats[2];
        fVar7 = 1.0 / SQRT(fVar1 * fVar1 + fVar2 * fVar2 + fVar8 * fVar8);
        *(ulong *)(this->m_angularVelocity).m_floats =
             CONCAT44(fVar4 + fVar7 * fVar8 * -0.005,fVar2 + fVar7 * fVar2 * -0.005);
        (this->m_angularVelocity).m_floats[2] = fVar1 * fVar7 * -0.005 + fVar1;
      }
    }
  }
  return;
}

Assistant:

void			btRigidBody::applyDamping(btScalar timeStep)
{
	//On new damping: see discussion/issue report here: http://code.google.com/p/bullet/issues/detail?id=74
	//todo: do some performance comparisons (but other parts of the engine are probably bottleneck anyway

//#define USE_OLD_DAMPING_METHOD 1
#ifdef USE_OLD_DAMPING_METHOD
	m_linearVelocity *= GEN_clamped((btScalar(1.) - timeStep * m_linearDamping), (btScalar)btScalar(0.0), (btScalar)btScalar(1.0));
	m_angularVelocity *= GEN_clamped((btScalar(1.) - timeStep * m_angularDamping), (btScalar)btScalar(0.0), (btScalar)btScalar(1.0));
#else
	m_linearVelocity *= btPow(btScalar(1)-m_linearDamping, timeStep);
	m_angularVelocity *= btPow(btScalar(1)-m_angularDamping, timeStep);
#endif

	if (m_additionalDamping)
	{
		//Additional damping can help avoiding lowpass jitter motion, help stability for ragdolls etc.
		//Such damping is undesirable, so once the overall simulation quality of the rigid body dynamics system has improved, this should become obsolete
		if ((m_angularVelocity.length2() < m_additionalAngularDampingThresholdSqr) &&
			(m_linearVelocity.length2() < m_additionalLinearDampingThresholdSqr))
		{
			m_angularVelocity *= m_additionalDampingFactor;
			m_linearVelocity *= m_additionalDampingFactor;
		}
	

		btScalar speed = m_linearVelocity.length();
		if (speed < m_linearDamping)
		{
			btScalar dampVel = btScalar(0.005);
			if (speed > dampVel)
			{
				btVector3 dir = m_linearVelocity.normalized();
				m_linearVelocity -=  dir * dampVel;
			} else
			{
				m_linearVelocity.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
			}
		}

		btScalar angSpeed = m_angularVelocity.length();
		if (angSpeed < m_angularDamping)
		{
			btScalar angDampVel = btScalar(0.005);
			if (angSpeed > angDampVel)
			{
				btVector3 dir = m_angularVelocity.normalized();
				m_angularVelocity -=  dir * angDampVel;
			} else
			{
				m_angularVelocity.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
			}
		}
	}
}